

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O2

optional<slang::ConstantRange>
slang::ConstantRange::getIndexedRange(int32_t l,int32_t r,bool littleEndian,bool indexedUp)

{
  ulong in_RAX;
  _Storage<slang::ConstantRange,_true> _Var1;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  optional<slang::ConstantRange> oVar6;
  optional<slang::ConstantRange> oVar7;
  
  uVar4 = (ulong)(uint)l;
  iVar2 = r + -1;
  if (CONCAT31(in_register_00000009,indexedUp) == 0) {
    bVar5 = SBORROW4(l,iVar2);
    in_RAX = (ulong)(uint)(l - iVar2);
    uVar3 = (ulong)(uint)l;
    uVar4 = (ulong)(uint)(l - iVar2);
  }
  else {
    bVar5 = SCARRY4(iVar2,l);
    uVar3 = (ulong)(uint)(iVar2 + l);
  }
  if (bVar5) {
    oVar6.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._8_4_ = 0;
    oVar6.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload =
         (_Storage<slang::ConstantRange,_true>)in_RAX;
    return (optional<slang::ConstantRange>)
           oVar6.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>;
  }
  if (littleEndian) {
    _Var1 = (_Storage<slang::ConstantRange,_true>)(uVar3 | uVar4 << 0x20);
  }
  else {
    _Var1 = (_Storage<slang::ConstantRange,_true>)(uVar4 | uVar3 << 0x20);
  }
  oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ =
       (undefined4)CONCAT71(in_register_00000011,1);
  oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = _Var1;
  return (optional<slang::ConstantRange>)
         oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> ConstantRange::getIndexedRange(int32_t l, int32_t r, bool littleEndian,
                                                            bool indexedUp) {
    ConstantRange result;
    int32_t count = r - 1;
    if (indexedUp) {
        auto upper = checkedAddS32(l, count);
        if (!upper)
            return std::nullopt;

        result.left = *upper;
        result.right = l;
    }
    else {
        auto lower = checkedSubS32(l, count);
        if (!lower)
            return std::nullopt;

        result.left = l;
        result.right = *lower;
    }

    if (!littleEndian)
        return result.reverse();

    return result;
}